

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# move.c
# Opt level: O1

void movePack_free(MovePack *movePack,_Bool freeMoves)

{
  ulong uVar1;
  
  if (movePack != (MovePack *)0x0) {
    if ((freeMoves) && (movePack->movesCount != 0)) {
      uVar1 = 0;
      do {
        move_free(movePack->moves[uVar1]);
        uVar1 = uVar1 + 1;
      } while (uVar1 < movePack->movesCount);
    }
    free(movePack->moves);
    free(movePack);
    return;
  }
  return;
}

Assistant:

void movePack_free(MovePack * movePack, bool freeMoves)
{
	unsigned long i;

	if(!movePack)
		return;

	if(freeMoves)
	{
		for(i=0;i<movePack->movesCount;i++)
		{
			move_free(movePack->moves[i]);
		}
	}
	
	free(movePack->moves);
	free(movePack);
}